

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgFrame.c
# Opt level: O0

uint zvgFrameSend(void)

{
  uint uVar1;
  uint local_c;
  uint err;
  
  zvgEncEOF();
  uVar1 = zvgEncSize();
  local_c = zvgDmaPutMem(EncodeBfr,uVar1);
  if (local_c == 0) {
    zvgEncClearBfr();
    local_c = zvgDmaSendSwap();
    if (local_c == 0) {
      zvgEncSOF();
      uVar1 = zvgEncSize();
      local_c = zvgDmaPutMem(EncodeBfr,uVar1);
      if (local_c == 0) {
        zvgEncClearBfr();
        local_c = 0;
      }
    }
  }
  return local_c;
}

Assistant:

uint zvgFrameSend(void)
{
	uint	err;

	// Send End of Frame info. (Center Trace, pad ZVG buffer)
	zvgEncEOF();

	err = zvgDmaPutMem( EncodeBfr, zvgEncSize());

	if (err)
		return (err);

	// wait for the end of the frame, using the timer functions
	//tmrWaitForFrame();

	zvgEncClearBfr();				// Clear the encode buffer

	// Start the DMA transfer of the encoded command in the DMA buffer to
	// the ZVG.  SCJ: NEED TO DO A "PREV SWAP!", since the "current" buffer will
	// have bupkis in it due to having no points in the frame!!!

	//if(npoints > 0)
	//{
		err = zvgDmaSendSwap();		// send the current buffer and swap DMA buffers
	//}
	//else
	//{
	//	err = zvgDmaSendPrev();		// if there are no points, send previous
	//}

	if (err)
		return (err);

	// Start next buffer with spot kill stuff if needed

	zvgEncSOF();

	err = zvgDmaPutMem( EncodeBfr, zvgEncSize());

	if (err)
		return (err);

	zvgEncClearBfr();				// Clear the encode buffer
	return (errOk);
}